

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

void Gia_ManPrintCollect2_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vNodes)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *vNodes_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjId(p,pObj);
  iVar1 = Vec_IntFind(vNodes,iVar1);
  if (iVar1 < 0) {
    iVar1 = Gia_ObjIsCo(pObj);
    if ((iVar1 != 0) || (iVar1 = Gia_ObjIsAnd(pObj), iVar1 != 0)) {
      pGVar2 = Gia_ObjFanin0(pObj);
      Gia_ManPrintCollect2_rec(p,pGVar2,vNodes);
    }
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 != 0) {
      pGVar2 = Gia_ObjFanin1(pObj);
      Gia_ManPrintCollect2_rec(p,pGVar2,vNodes);
    }
    iVar1 = Gia_ObjIsMux(p,pObj);
    if (iVar1 != 0) {
      pGVar2 = Gia_ObjFanin2(p,pObj);
      Gia_ManPrintCollect2_rec(p,pGVar2,vNodes);
    }
    iVar1 = Gia_ObjId(p,pObj);
    Vec_IntPush(vNodes,iVar1);
  }
  return;
}

Assistant:

void Gia_ManPrintCollect2_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vNodes )
{
    if ( Vec_IntFind(vNodes, Gia_ObjId(p, pObj)) >= 0 )
        return;
    if ( Gia_ObjIsCo(pObj) || Gia_ObjIsAnd(pObj) )
        Gia_ManPrintCollect2_rec( p, Gia_ObjFanin0(pObj), vNodes );
    if ( Gia_ObjIsAnd(pObj) )
        Gia_ManPrintCollect2_rec( p, Gia_ObjFanin1(pObj), vNodes );
    if ( Gia_ObjIsMux(p, pObj) )
        Gia_ManPrintCollect2_rec( p, Gia_ObjFanin2(p, pObj), vNodes );
    Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
}